

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::render::rect(cvui_block_t *theBlock,Rect *thePos,uint theBorderColor,uint theFillingColor
                       )

{
  int iVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  _InputArray local_210;
  _InputArray local_1f8;
  int local_1e0;
  int local_1dc;
  Rect aClippedRect;
  Scalar aFilling;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  Scalar aBorder;
  Mat aOverlay;
  _OutputArray local_100;
  Mat local_e8 [96];
  Mat local_88 [96];
  
  internal::hexToScalar(&aBorder,theBorderColor);
  internal::hexToScalar(&aFilling,theFillingColor);
  if ((aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] != 255.0) ||
     (NAN(aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]))) {
    if ((aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] != 0.0) ||
       (NAN(aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]))) {
      iVar1 = **(int **)&theBlock->field_0x40;
      iVar4 = thePos->x;
      local_1dc = thePos->y;
      aClippedRect.x = 0;
      if (0 < iVar4) {
        aClippedRect.x = iVar4;
      }
      aClippedRect.y = 0;
      if (0 < local_1dc) {
        aClippedRect.y = local_1dc;
      }
      iVar2 = (*(int **)&theBlock->field_0x40)[1];
      iVar4 = iVar4 + thePos->width;
      if (iVar2 < iVar4) {
        iVar4 = iVar2;
      }
      local_1dc = local_1dc + thePos->height;
      if (iVar1 < local_1dc) {
        local_1dc = iVar1;
      }
      local_1e0 = iVar4 - aClippedRect.x;
      if ((local_1e0 == 0 || iVar4 < aClippedRect.x) ||
         (local_1dc = local_1dc - aClippedRect.y, local_1dc < 1)) {
        aClippedRect.x = 0;
        aClippedRect.y = 0;
        local_1e0 = 0;
        local_1dc = 0;
      }
      aClippedRect.width = local_1e0;
      aClippedRect.height = local_1dc;
      cv::Mat::Mat(&aOverlay,&local_1e0,*(uint *)theBlock & 0xfff,&aFilling);
      local_1f8.sz.width = 0;
      local_1f8.sz.height = 0;
      local_1f8.flags = 0x1010000;
      local_1f8.obj = &aOverlay;
      cv::Mat::Mat(local_88,&theBlock->where,(Rect_ *)&aClippedRect);
      local_210.sz.width = 0;
      local_210.sz.height = 0;
      local_210.flags = 0x1010000;
      local_210.obj = local_88;
      cv::Mat::Mat(local_e8,&theBlock->where,(Rect_ *)&aClippedRect);
      dVar3 = aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] / -255.0 + 1.0;
      local_100.super__InputArray.sz.width = 0;
      local_100.super__InputArray.sz.height = 0;
      local_100.super__InputArray.flags = -0x3dff0000;
      local_100.super__InputArray.obj = local_e8;
      cv::addWeighted(&local_1f8,dVar3,&local_210,1.0 - dVar3,0.0,&local_100,-1);
      cv::Mat::~Mat(local_e8);
      cv::Mat::~Mat(local_88);
      cv::Mat::~Mat(&aOverlay);
    }
    else {
      _aOverlay = 0x3010000;
      local_198 = thePos->x;
      iStack_194 = thePos->y;
      iStack_190 = thePos->width;
      iStack_18c = thePos->height;
      cv::rectangle(&aOverlay,&local_198,&aFilling,0xffffffffffffffff,0x10,0);
    }
  }
  _aOverlay = 0x3010000;
  local_1a8 = thePos->x;
  iStack_1a4 = thePos->y;
  iStack_1a0 = thePos->width;
  iStack_19c = thePos->height;
  cv::rectangle(&aOverlay,&local_1a8,&aBorder,1,0x10,0);
  return;
}

Assistant:

void rect(cvui_block_t& theBlock, cv::Rect& thePos, unsigned int theBorderColor, unsigned int theFillingColor) {
		cv::Scalar aBorder = internal::hexToScalar(theBorderColor);
		cv::Scalar aFilling = internal::hexToScalar(theFillingColor);

		bool aHasFilling = aFilling[3] != 0xff;

		if (aHasFilling) {
			if (aFilling[3] == 0x00) {
				// full opacity
				cv::rectangle(theBlock.where, thePos, aFilling, CVUI_FILLED, CVUI_ANTIALISED);
			} else {
				cv::Rect aClippedRect = thePos & cv::Rect(cv::Point(0, 0), theBlock.where.size());
				double aAlpha = 1.00 - static_cast<double>(aFilling[3]) / 255;
				cv::Mat aOverlay(aClippedRect.size(), theBlock.where.type(), aFilling);
				cv::addWeighted(aOverlay, aAlpha, theBlock.where(aClippedRect), 1.00 - aAlpha, 0.0, theBlock.where(aClippedRect));
			}
		}

		// Render the border
		cv::rectangle(theBlock.where, thePos, aBorder, 1, CVUI_ANTIALISED);
	}